

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::MaybeCrossFileRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *from_file,Descriptor *to_message)

{
  Descriptor *descriptor;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((*(int *)(this + 0x44) == 1) && (*(GeneratorOptions **)(from_file + 0x10) != options)) {
    anon_unknown_0::ModuleAlias
              (&local_70,
               (string *)((*(GeneratorOptions **)(from_file + 0x10))->output_dir)._M_dataplus._M_p);
    GetNestedMessageName_abi_cxx11_
              (&local_90,*(_anonymous_namespace_ **)(from_file + 0x18),descriptor);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,".");
    std::operator+(__return_storage_ptr__,&local_30,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)from_file)
    ;
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    GetMessagePath_abi_cxx11_
              (__return_storage_ptr__,this,(GeneratorOptions *)from_file,(Descriptor *)from_file);
  }
  return __return_storage_ptr__;
}

Assistant:

string MaybeCrossFileRef(const GeneratorOptions& options,
                         const FileDescriptor* from_file,
                         const Descriptor* to_message) {
  if (options.import_style == GeneratorOptions::kImportCommonJs &&
      from_file != to_message->file()) {
    // Cross-file ref in CommonJS needs to use the module alias instead of
    // the global name.
    return ModuleAlias(to_message->file()->name()) +
           GetNestedMessageName(to_message->containing_type()) + "." +
           to_message->name();
  } else {
    // Within a single file we use a full name.
    return GetMessagePath(options, to_message);
  }
}